

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O1

double SRCTools::SincResampler::KaizerWindow::bessel(double x)

{
  uint i;
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = 0.0;
  uVar1 = 1;
  dVar4 = 1.0;
  do {
    dVar4 = dVar4 * ((x * 0.5) / (double)uVar1);
    dVar3 = dVar4 * dVar4;
    dVar6 = dVar5 * 1.11e-16;
    uVar1 = uVar1 + 1;
    uVar2 = -(ulong)(dVar6 < dVar3);
    dVar5 = (double)(~uVar2 & (ulong)dVar5 | (ulong)(dVar5 + dVar3) & uVar2);
  } while (dVar6 < dVar3);
  return dVar5 + 1.0;
}

Assistant:

double KaizerWindow::bessel(const double x) {
	static const double EPS = 1.11E-16;

	double sum = 0.0;
	double f = 1.0;
	for (unsigned int i = 1;; ++i) {
		f *= (0.5 * x / i);
		double f2 = f * f;
		if (f2 <= sum * EPS) break;
		sum += f2;
	}
	return 1.0 + sum;
}